

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void process_definitions(Context *ctx)

{
  RegisterType RVar1;
  uint regnum;
  RegisterList *pRVar2;
  bool bVar3;
  RegisterList *pRVar4;
  RegisterList *pRVar5;
  RegisterList *pRVar6;
  RegisterList *item;
  RegisterList *pRVar7;
  uint uVar8;
  uint uVar9;
  VariableList *pVVar10;
  RegisterList *pRVar11;
  
  determine_constants_arrays(ctx);
  pRVar5 = (ctx->used_registers).next;
  if (pRVar5 != (RegisterList *)0x0) {
    pRVar11 = &ctx->uniforms;
    pRVar4 = &ctx->used_registers;
    do {
      pRVar2 = pRVar5->next;
      RVar1 = pRVar5->regtype;
      regnum = pRVar5->regnum;
      pRVar7 = (ctx->defined_registers).next;
      pRVar6 = pRVar5;
      if (pRVar7 != (RegisterList *)0x0) {
        uVar8 = RVar1 << 0x10 | regnum;
        do {
          uVar9 = pRVar7->regtype << 0x10 | pRVar7->regnum;
          if (uVar8 == uVar9) goto LAB_0010b33c;
        } while ((uVar9 <= uVar8) && (pRVar7 = pRVar7->next, pRVar7 != (RegisterList *)0x0));
      }
      switch(RVar1) {
      case REG_TYPE_TEMP:
      case REG_TYPE_ADDRESS:
      case REG_TYPE_LOOP:
      case REG_TYPE_LABEL:
      case REG_TYPE_MAX:
        (*ctx->profile->global_emitter)(ctx,RVar1,regnum);
        break;
      case REG_TYPE_INPUT:
        if ((ctx->shader_type != MOJOSHADER_TYPE_PIXEL) || (1 < ctx->major_ver))
        goto switchD_0010b288_caseD_a;
        pRVar5 = reglist_insert(ctx,&ctx->attributes,REG_TYPE_INPUT,regnum);
        pRVar5->usage = MOJOSHADER_USAGE_COLOR;
        pRVar5->index = regnum;
        pRVar5->writemask = 0xf;
        pRVar5->misc = 0;
        break;
      case REG_TYPE_CONST:
      case REG_TYPE_CONSTINT:
      case REG_TYPE_CONSTBOOL:
        pRVar4->next = pRVar2;
        pRVar5->next = (RegisterList *)0x0;
        pRVar11->next = pRVar5;
        pRVar6 = pRVar4;
        pRVar11 = pRVar5;
        break;
      case REG_TYPE_RASTOUT:
      case REG_TYPE_ATTROUT:
      case REG_TYPE_OUTPUT:
      case REG_TYPE_COLOROUT:
      case REG_TYPE_DEPTHOUT:
        if ((ctx->shader_type == MOJOSHADER_TYPE_VERTEX) && (2 < ctx->major_ver)) {
          failf(ctx,"%s","vs_3 can\'t use output registers without declaring them first.");
          return;
        }
        pRVar5 = reglist_insert(ctx,&ctx->attributes,RVar1,regnum);
        pRVar5->usage = MOJOSHADER_USAGE_UNKNOWN;
        pRVar5->index = 0;
        pRVar5->writemask = 0xf;
        pRVar5->misc = 0;
        break;
      default:
switchD_0010b288_caseD_a:
        failf(ctx,"%s","BUG: we used a register we don\'t know how to define.");
      }
LAB_0010b33c:
      pRVar4 = pRVar6;
      pRVar5 = pRVar2;
    } while (pRVar2 != (RegisterList *)0x0);
  }
  for (pVVar10 = ctx->variables; pVVar10 != (VariableList *)0x0; pVVar10 = pVVar10->next) {
    if (pVVar10->used != 0) {
      if (pVVar10->constant == (ConstantsList *)0x0) {
        (*ctx->profile->array_emitter)(ctx,pVVar10);
        ctx->uniform_float4_count = ctx->uniform_float4_count + pVVar10->count;
      }
      else {
        (*ctx->profile->const_array_emitter)(ctx,pVVar10->constant,pVVar10->index,pVVar10->count);
      }
      ctx->uniform_count = ctx->uniform_count + 1;
    }
  }
  pRVar5 = (ctx->uniforms).next;
  if (pRVar5 != (RegisterList *)0x0) {
    pVVar10 = (VariableList *)0x0;
    do {
      bVar3 = true;
      if (pRVar5->regtype == REG_TYPE_CONST) {
        for (pVVar10 = ctx->variables; pVVar10 != (VariableList *)0x0; pVVar10 = pVVar10->next) {
          if (pVVar10->used != 0) {
            if ((pVVar10->index <= pRVar5->regnum) &&
               (pRVar5->regnum < pVVar10->index + pVVar10->count)) {
              if (pVVar10->constant != (ConstantsList *)0x0) {
                __assert_fail("!var->constant",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                              ,0x2e65,"void process_definitions(Context *)");
              }
              pRVar5->array = pVVar10;
              bVar3 = false;
              goto LAB_0010b3e5;
            }
          }
        }
        pVVar10 = (VariableList *)0x0;
      }
LAB_0010b3e5:
      (*ctx->profile->uniform_emitter)(ctx,pRVar5->regtype,pRVar5->regnum,pVVar10);
      if (bVar3) {
        ctx->uniform_count = ctx->uniform_count + 1;
        RVar1 = pRVar5->regtype;
        if (RVar1 == REG_TYPE_CONSTBOOL) {
          ctx->uniform_bool_count = ctx->uniform_bool_count + 1;
        }
        else if (RVar1 == REG_TYPE_CONSTINT) {
          ctx->uniform_int4_count = ctx->uniform_int4_count + 1;
        }
        else if (RVar1 == REG_TYPE_CONST) {
          ctx->uniform_float4_count = ctx->uniform_float4_count + 1;
        }
      }
      pRVar5 = pRVar5->next;
    } while (pRVar5 != (RegisterList *)0x0);
  }
  for (pRVar5 = (ctx->samplers).next; pRVar5 != (RegisterList *)0x0; pRVar5 = pRVar5->next) {
    ctx->sampler_count = ctx->sampler_count + 1;
    (*ctx->profile->sampler_emitter)(ctx,pRVar5->regnum,pRVar5->index,SUB14(pRVar5->misc != 0,0));
  }
  for (pRVar5 = (ctx->attributes).next; pRVar5 != (RegisterList *)0x0; pRVar5 = pRVar5->next) {
    ctx->attribute_count = ctx->attribute_count + 1;
    (*ctx->profile->attribute_emitter)
              (ctx,pRVar5->regtype,pRVar5->regnum,pRVar5->usage,pRVar5->index,pRVar5->writemask,
               pRVar5->misc);
  }
  return;
}

Assistant:

static void process_definitions(Context *ctx)
{
    // !!! FIXME: apparently, pre ps_3_0, sampler registers don't need to be
    // !!! FIXME:  DCL'd before use (default to 2d?). We aren't checking
    // !!! FIXME:  this at the moment, though.

    determine_constants_arrays(ctx);  // in case this hasn't been called yet.

    RegisterList *uitem = &ctx->uniforms;
    RegisterList *prev = &ctx->used_registers;
    RegisterList *item = prev->next;

    while (item != NULL)
    {
        RegisterList *next = item->next;
        const RegisterType regtype = item->regtype;
        const int regnum = item->regnum;

        if (!get_defined_register(ctx, regtype, regnum))
        {
            // haven't already dealt with this one.
            switch (regtype)
            {
                // !!! FIXME: I'm not entirely sure this is right...
                case REG_TYPE_RASTOUT:
                case REG_TYPE_ATTROUT:
                case REG_TYPE_TEXCRDOUT:
                case REG_TYPE_COLOROUT:
                case REG_TYPE_DEPTHOUT:
                    if (shader_is_vertex(ctx)&&shader_version_atleast(ctx,3,0))
                    {
                        fail(ctx, "vs_3 can't use output registers"
                                  " without declaring them first.");
                        return;
                    } // if

                    // Apparently this is an attribute that wasn't DCL'd.
                    //  Add it to the attribute list; deal with it later.
                    // !!! FIXME: we should use something other than UNKNOWN here.
                    add_attribute_register(ctx, regtype, regnum,
                                           MOJOSHADER_USAGE_UNKNOWN, 0, 0xF, 0);
                    break;

                case REG_TYPE_ADDRESS:
                case REG_TYPE_PREDICATE:
                case REG_TYPE_TEMP:
                case REG_TYPE_LOOP:
                case REG_TYPE_LABEL:
                    ctx->profile->global_emitter(ctx, regtype, regnum);
                    break;

                case REG_TYPE_CONST:
                case REG_TYPE_CONSTINT:
                case REG_TYPE_CONSTBOOL:
                    // separate uniforms into a different list for now.
                    prev->next = next;
                    item->next = NULL;
                    uitem->next = item;
                    uitem = item;
                    item = prev;
                    break;

                case REG_TYPE_INPUT:
                    // You don't have to dcl_ your inputs in Shader Model 1.
                    if (shader_is_pixel(ctx)&&!shader_version_atleast(ctx,2,0))
                    {
                        add_attribute_register(ctx, regtype, regnum,
                                               MOJOSHADER_USAGE_COLOR, regnum,
                                               0xF, 0);
                        break;
                    } // if
                    // fall through...

                default:
                    fail(ctx, "BUG: we used a register we don't know how to define.");
            } // switch
        } // if

        prev = item;
        item = next;
    } // while

    // okay, now deal with uniform/constant arrays...
    VariableList *var;
    for (var = ctx->variables; var != NULL; var = var->next)
    {
        if (var->used)
        {
            if (var->constant)
            {
                ctx->profile->const_array_emitter(ctx, var->constant,
                                                  var->index, var->count);
            } // if
            else
            {
                ctx->profile->array_emitter(ctx, var);
                ctx->uniform_float4_count += var->count;
            } // else
            ctx->uniform_count++;
        } // if
    } // for

    // ...and uniforms...
    for (item = ctx->uniforms.next; item != NULL; item = item->next)
    {
        int arraysize = -1;

        // check if this is a register contained in an array...
        if (item->regtype == REG_TYPE_CONST)
        {
            for (var = ctx->variables; var != NULL; var = var->next)
            {
                if (!var->used)
                    continue;

                const int regnum = item->regnum;
                const int lo = var->index;
                if ( (regnum >= lo) && (regnum < (lo + var->count)) )
                {
                    assert(!var->constant);
                    item->array = var;  // used when building parseData.
                    arraysize = var->count;
                    break;
                } // if
            } // for
        } // if

        ctx->profile->uniform_emitter(ctx, item->regtype, item->regnum, var);

        if (arraysize < 0)  // not part of an array?
        {
            ctx->uniform_count++;
            switch (item->regtype)
            {
                case REG_TYPE_CONST: ctx->uniform_float4_count++; break;
                case REG_TYPE_CONSTINT: ctx->uniform_int4_count++; break;
                case REG_TYPE_CONSTBOOL: ctx->uniform_bool_count++; break;
                default: break;
            } // switch
        } // if
    } // for

    // ...and samplers...
    for (item = ctx->samplers.next; item != NULL; item = item->next)
    {
        ctx->sampler_count++;
        ctx->profile->sampler_emitter(ctx, item->regnum,
                                      (TextureType) item->index,
                                      item->misc != 0);
    } // for

    // ...and attributes...
    for (item = ctx->attributes.next; item != NULL; item = item->next)
    {
        ctx->attribute_count++;
        ctx->profile->attribute_emitter(ctx, item->regtype, item->regnum,
                                        item->usage, item->index,
                                        item->writemask, item->misc);
    } // for
}